

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention.cpp
# Opt level: O1

void ncnn::dynamic_quantize_2d(Mat *blob,Mat *blob_int8,float *scale,Option *opt)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  int iVar6;
  void *pvVar7;
  long lVar8;
  int j;
  ulong uVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  
  Mat::create(blob_int8,blob->w,blob->h,1,1,opt->workspace_allocator);
  fVar11 = 0.0;
  if (0 < (long)blob_int8->h) {
    pvVar7 = blob->data;
    lVar8 = 0;
    do {
      if (0 < blob_int8->w) {
        uVar9 = 0;
        do {
          fVar12 = ABS(*(float *)((long)pvVar7 + uVar9 * 4));
          if (fVar11 <= fVar12) {
            fVar11 = fVar12;
          }
          uVar9 = uVar9 + 1;
        } while ((uint)blob_int8->w != uVar9);
      }
      lVar8 = lVar8 + 1;
      pvVar7 = (void *)((long)pvVar7 + (long)blob->w * blob->elemsize);
    } while (lVar8 != blob_int8->h);
  }
  *scale = (float)(-(uint)(fVar11 == 0.0) & 0x3f800000 |
                  ~-(uint)(fVar11 == 0.0) & (uint)(127.0 / fVar11));
  if (0 < blob_int8->h) {
    lVar8 = 0;
    do {
      iVar1 = blob_int8->w;
      if (0 < (long)iVar1) {
        iVar2 = blob->w;
        sVar3 = blob_int8->elemsize;
        pvVar7 = blob_int8->data;
        sVar4 = blob->elemsize;
        pvVar5 = blob->data;
        lVar10 = 0;
        do {
          fVar11 = roundf(*scale * *(float *)((long)pvVar5 +
                                             lVar10 * 4 + sVar4 * lVar8 * (long)iVar2));
          iVar6 = (int)fVar11;
          if (iVar6 < -0x7e) {
            iVar6 = -0x7f;
          }
          if (0x7e < iVar6) {
            iVar6 = 0x7f;
          }
          *(char *)((long)pvVar7 + lVar10 + sVar3 * lVar8 * (long)iVar1) = (char)iVar6;
          lVar10 = lVar10 + 1;
        } while (lVar10 < blob_int8->w);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < blob_int8->h);
  }
  return;
}

Assistant:

static void dynamic_quantize_2d(const Mat& blob, Mat& blob_int8, float& scale, const Option& opt)
{
    blob_int8.create(blob.w, blob.h, (size_t)1u, 1, opt.workspace_allocator);

    float absmax = 0.f;
    for (int i = 0; i < blob_int8.h; i++)
    {
        const float* ptr = blob.row(i);

        for (int j = 0; j < blob_int8.w; j++)
        {
            absmax = std::max(absmax, (float)fabs(ptr[j]));
        }
    }

    scale = absmax == 0.f ? 1.f : 127.f / absmax;

    for (int i = 0; i < blob_int8.h; i++)
    {
        const float* ptr = blob.row(i);
        signed char* outptr = blob_int8.row<signed char>(i);

        for (int j = 0; j < blob_int8.w; j++)
        {
            outptr[j] = float2int8(ptr[j] * scale);
        }
    }
}